

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::TiledRgbaInputFile::readTile(TiledRgbaInputFile *this,int dx,int dy,int lx,int ly)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  
  __mutex = (pthread_mutex_t *)this->_fromYa;
  if (__mutex == (pthread_mutex_t *)0x0) {
    TiledInputFile::readTile(this->_inputFile,dx,dy,lx,ly);
    return;
  }
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    FromYa::readTile(this->_fromYa,dx,dy,lx,ly);
    pthread_mutex_unlock(__mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void
TiledRgbaInputFile::readTile (int dx, int dy, int lx, int ly)
{
    if (_fromYa)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_fromYa);
#endif
        _fromYa->readTile (dx, dy, lx, ly);
    }
    else { _inputFile->readTile (dx, dy, lx, ly); }
}